

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# breadcrumb.c
# Opt level: O3

void push_breadcrumb(CgreenBreadcrumb *breadcrumb,char *name)

{
  int iVar1;
  int iVar2;
  char **__ptr;
  int iVar3;
  
  iVar1 = breadcrumb->depth;
  iVar3 = iVar1 + 1;
  breadcrumb->depth = iVar3;
  iVar2 = breadcrumb->space;
  __ptr = breadcrumb->trail;
  if (iVar2 <= iVar1) {
    breadcrumb->space = iVar2 + 1;
    __ptr = (char **)realloc(__ptr,(long)iVar2 * 8 + 8);
    if (__ptr == (char **)0x0) {
      breadcrumb->space = breadcrumb->space + -1;
      breadcrumb->depth = breadcrumb->depth + -1;
      return;
    }
    breadcrumb->trail = __ptr;
    iVar3 = breadcrumb->depth;
  }
  __ptr[(long)iVar3 + -1] = name;
  return;
}

Assistant:

void push_breadcrumb(CgreenBreadcrumb *breadcrumb, const char *name) {
    breadcrumb->depth++;
    if (breadcrumb->depth > breadcrumb->space) {
        const char **tmp;
        breadcrumb->space++;
        tmp = (const char**) realloc((void*)breadcrumb->trail,
                sizeof(const char *) * breadcrumb->space);
        if (tmp == NULL) {
            breadcrumb->space--;
            breadcrumb->depth--;
            return;
        }
        breadcrumb->trail = tmp;
    }
    breadcrumb->trail[breadcrumb->depth - 1] = name;
}